

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_create_with_capacity(uint32_t cap)

{
  roaring_bitmap_t *prVar1;
  void **ppvVar2;
  uint uVar3;
  ulong uVar4;
  
  prVar1 = (roaring_bitmap_t *)(*global_memory_hook.malloc)(0x28);
  if (prVar1 != (roaring_bitmap_t *)0x0) {
    (prVar1->high_low_container).keys = (uint16_t *)0x0;
    (prVar1->high_low_container).typecodes = (uint8_t *)0x0;
    (prVar1->high_low_container).size = 0;
    (prVar1->high_low_container).allocation_size = 0;
    (prVar1->high_low_container).containers = (void **)0x0;
    (prVar1->high_low_container).flags = '\0';
    uVar3 = 0x10000;
    if (cap < 0x10000) {
      uVar3 = cap;
    }
    if (cap == 0) {
      return prVar1;
    }
    uVar4 = (ulong)uVar3;
    ppvVar2 = (void **)(*global_memory_hook.malloc)(uVar4 * 0xb);
    if (ppvVar2 != (void **)0x0) {
      (prVar1->high_low_container).containers = ppvVar2;
      (prVar1->high_low_container).keys = (uint16_t *)(ppvVar2 + uVar4);
      (prVar1->high_low_container).typecodes = (uint8_t *)((long)(ppvVar2 + uVar4) + uVar4 * 2);
      (prVar1->high_low_container).allocation_size = uVar3;
      return prVar1;
    }
    (*global_memory_hook.free)(prVar1);
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_create_with_capacity(uint32_t cap) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    bool is_ok = ra_init_with_capacity(&ans->high_low_container, cap);
    if (!is_ok) {
        roaring_free(ans);
        return NULL;
    }
    return ans;
}